

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
FastVector<UnsatisfiedJump,_false,_false>::grow_no_destroy
          (FastVector<UnsatisfiedJump,_false,_false> *this,uint newSize)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  UnsatisfiedJump *dst;
  uint uVar4;
  ulong uVar5;
  uchar **ppuVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar4 = (this->max >> 1) + this->max;
  uVar1 = newSize + 0x20;
  if (newSize < uVar4) {
    uVar1 = uVar4;
  }
  dst = (UnsatisfiedJump *)(*(code *)NULLC::alloc)(uVar1 << 4 | 4);
  auVar3 = _DAT_001f5d70;
  auVar2 = _DAT_001f5d60;
  if (uVar1 != 0) {
    uVar5 = (long)(int)uVar1 + 0xfffffffffffffffU & 0xfffffffffffffff;
    auVar8._8_4_ = (int)uVar5;
    auVar8._0_8_ = uVar5;
    auVar8._12_4_ = (int)(uVar5 >> 0x20);
    ppuVar6 = &dst[1].jmpPos;
    lVar7 = 0;
    auVar8 = auVar8 ^ _DAT_001f5d70;
    do {
      auVar9._8_4_ = (int)lVar7;
      auVar9._0_8_ = lVar7;
      auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar9 = (auVar9 | auVar2) ^ auVar3;
      if ((bool)(~(auVar9._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar9._0_4_ ||
                  auVar8._4_4_ < auVar9._4_4_) & 1)) {
        ppuVar6[-2] = (uchar *)0x0;
      }
      if ((auVar9._12_4_ != auVar8._12_4_ || auVar9._8_4_ <= auVar8._8_4_) &&
          auVar9._12_4_ <= auVar8._12_4_) {
        *ppuVar6 = (uchar *)0x0;
      }
      lVar7 = lVar7 + 2;
      ppuVar6 = ppuVar6 + 4;
    } while ((uVar5 - ((uint)((long)(int)uVar1 + 0xfffffffffffffffU) & 1)) + 2 != lVar7);
  }
  if (dst != (UnsatisfiedJump *)0x0) {
    if (this->data != (UnsatisfiedJump *)0x0) {
      NULLC::copyMemory(dst,this->data,(ulong)this->max << 4);
    }
    this->data = dst;
    this->max = uVar1;
    return;
  }
  __assert_fail("newData",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0xa7,
                "void FastVector<UnsatisfiedJump>::grow_no_destroy(unsigned int) [T = UnsatisfiedJump, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

void grow_no_destroy(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 32;

		T* newData;

		if(!skipConstructor)
			newData = NULLC::construct<T>(newSize);
		else
			newData = (T*)NULLC::alignedAlloc(sizeof(T) * newSize);

		assert(newData);

		if(zeroNewMemory)
			NULLC::fillMemory(newData, 0, newSize * sizeof(T));

		if(data)
			NULLC::copyMemory(newData, data, max * sizeof(T));

		data = newData;
		max = newSize;
	}